

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

int eynorr(char *sp)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 1;
  if (inmacro == 0) {
    ewprintf("%s? (y, n or r) ",sp);
    while (uVar1 = getkey(0), uVar1 != 0xd) {
      if (uVar1 == 0x20) {
LAB_0010b8bf:
        eerase();
        return 1;
      }
      if (uVar1 == 0x4e) break;
      if (uVar1 == 0x79) goto LAB_0010b8bf;
      if (uVar1 == 0x6e) break;
      if (uVar1 == 0x59) goto LAB_0010b8bf;
      if ((uVar1 & 0xffffffdf) == 0x52) {
        eerase();
        return 4;
      }
      if (uVar1 == 7) {
        eerase();
        iVar2 = ctrlg(8,1);
        return iVar2;
      }
      ewprintf("Please answer y, n or r.");
    }
    eerase();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
eynorr(const char *sp)
{
	int	 s;

	if (inmacro)
		return (TRUE);

	ewprintf("%s? (y, n or r) ", sp);
	for (;;) {
		s = getkey(FALSE);
		if (s == 'y' || s == 'Y' || s == ' ') {
			eerase();
			return (TRUE);
		}
		if (s == 'n' || s == 'N' || s == CCHR('M')) {
			eerase();
			return (FALSE);
		}
		if (s == 'r' || s == 'R') {
			eerase();
			return (REVERT);
		}
		if (s == CCHR('G')) {
			eerase();
			return (ctrlg(FFRAND, 1));
		}
		ewprintf("Please answer y, n or r.");
	}
	/* NOTREACHED */
}